

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

bool __thiscall GlobOpt::IsWorthSpecializingToInt32DueToDst(GlobOpt *this,Opnd *dst)

{
  StackSym *sym;
  Loop *pLVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  RegOpnd *pRVar6;
  
  if (dst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1d3b,"(dst)","dst");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pRVar6 = IR::Opnd::AsRegOpnd(dst);
  sym = pRVar6->m_sym;
  bVar3 = GlobOptBlockData::IsInt32TypeSpecialized(&this->currentBlock->globOptData,&sym->super_Sym)
  ;
  bVar4 = true;
  if (!bVar3) {
    pLVar1 = this->currentBlock->loop;
    if (pLVar1 != (Loop *)0x0) {
      bVar3 = GlobOptBlockData::IsLive(&pLVar1->landingPad->globOptData,&sym->super_Sym);
      return bVar3;
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool
GlobOpt::IsWorthSpecializingToInt32DueToDst(IR::Opnd *const dst)
{
    Assert(dst);

    const auto sym = dst->AsRegOpnd()->m_sym;
    return
        CurrentBlockData()->IsInt32TypeSpecialized(sym) ||
        (this->currentBlock->loop && this->currentBlock->loop->landingPad->globOptData.IsLive(sym));
}